

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTimeAccess.cpp
# Opt level: O0

long __thiscall bhf::ads::RTimeAccess::ShowLatency(RTimeAccess *this,uint32_t indexOffset)

{
  ostream *os;
  byte local_39;
  undefined1 local_38 [7];
  uint8_t cpuId;
  RTimeCpuSettings info;
  uint32_t indexOffset_local;
  RTimeAccess *this_local;
  
  info.nCpuFreq = indexOffset;
  ReadCpuSettings((RTimeCpuSettings *)local_38,this);
  os = std::operator<<((ostream *)&std::cout,"RTimeCpuSettings:\n");
  ::operator<<(os,(RTimeCpuSettings *)local_38);
  for (local_39 = 0; local_39 < 0x40; local_39 = local_39 + 1) {
    if ((info._0_8_ & 1L << (local_39 & 0x3f)) != 0) {
      ShowLatency(this,info.nCpuFreq,(uint)local_39);
    }
  }
  return 0;
}

Assistant:

long RTimeAccess::ShowLatency(const uint32_t indexOffset) const
{
    const auto info = ReadCpuSettings();

    std::cout << "RTimeCpuSettings:\n" << info;
    for (uint8_t cpuId = 0; cpuId < 8 * sizeof(info.affinityMask); ++cpuId) {
        static_assert((8 * sizeof(info.affinityMask) < std::numeric_limits<decltype(cpuId)>::max()),
                      "cpuId is to small for affinityMask");
        if (info.affinityMask & (1ULL << cpuId)) {
            ShowLatency(indexOffset, cpuId);
        }
    }
    return 0;
}